

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O1

int __thiscall
muduo::FileUtil::ReadSmallFile::readToString<std::__cxx11::string>
          (ReadSmallFile *this,int maxSize,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content,
          int64_t *fileSize,int64_t *modifyTime,int64_t *createTime)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  size_t __nbytes;
  stat statbuf;
  int local_c4;
  stat local_c0;
  
  local_c4 = this->err_;
  if (-1 < this->fd_) {
    content->_M_string_length = 0;
    *(content->_M_dataplus)._M_p = '\0';
    if (fileSize != (int64_t *)0x0) {
      iVar1 = fstat(this->fd_,&local_c0);
      if (iVar1 == 0) {
        if ((local_c0.st_mode & 0xf000) == 0x4000) {
          local_c4 = 0x15;
        }
        else if ((local_c0.st_mode & 0xf000) == 0x8000) {
          *fileSize = local_c0.st_size;
          std::__cxx11::string::reserve((ulong)content);
        }
        if (modifyTime != (int64_t *)0x0) {
          *modifyTime = local_c0.st_mtim.tv_sec;
        }
        if (createTime != (int64_t *)0x0) {
          *createTime = local_c0.st_ctim.tv_sec;
        }
      }
      else {
        piVar2 = __errno_location();
        local_c4 = *piVar2;
      }
    }
    do {
      __nbytes = (long)maxSize - content->_M_string_length;
      if ((ulong)(long)maxSize < content->_M_string_length || __nbytes == 0) {
        return local_c4;
      }
      if (0xffff < __nbytes) {
        __nbytes = 0x10000;
      }
      sVar3 = read(this->fd_,this->buf_,__nbytes);
      if (sVar3 < 1) {
        if (sVar3 < 0) {
          piVar2 = __errno_location();
          local_c4 = *piVar2;
        }
      }
      else {
        std::__cxx11::string::append((char *)content,(ulong)this->buf_);
      }
    } while (0 < sVar3);
  }
  return local_c4;
}

Assistant:

int FileUtil::ReadSmallFile::readToString(int maxSize,
                                          String* content,
                                          int64_t* fileSize,
                                          int64_t* modifyTime,
                                          int64_t* createTime)
{
  static_assert(sizeof(off_t) == 8, "_FILE_OFFSET_BITS = 64");
  assert(content != NULL);
  int err = err_;
  if (fd_ >= 0)  //fd正常打开
  {
    content->clear(); //清空content里面的内容

    if (fileSize)  //文件大小不为0
    {
      struct stat statbuf;
      if (::fstat(fd_, &statbuf) == 0)
      {
        if (S_ISREG(statbuf.st_mode))
        {
          *fileSize = statbuf.st_size;
          content->reserve(static_cast<int>(std::min(implicit_cast<int64_t>(maxSize), *fileSize)));
        }
        else if (S_ISDIR(statbuf.st_mode))
        {
          err = EISDIR;
        }
        if (modifyTime)
        {
          *modifyTime = statbuf.st_mtime;
        }
        if (createTime)
        {
          *createTime = statbuf.st_ctime;
        }
      }//end <<if(fd > 0)>>
      else
      {
        err = errno;
      }
    }

    //如果内容存储区的大小小于最大的大小
    while (content->size() < implicit_cast<size_t>(maxSize))
    {
      size_t toRead = std::min(implicit_cast<size_t>(maxSize) - content->size(), sizeof(buf_));
      ssize_t n = ::read(fd_, buf_, toRead);
      if (n > 0)
      {
        content->append(buf_, n);
      }
      else
      {
        if (n < 0)
        {
          err = errno;
        }
        break;
      }
    }
  }
  return err;
}